

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_dup_mem_m68k
               (TCGContext_conflict2 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz)

{
  TCGType_conflict type;
  TCGv_vec pTVar1;
  TCGTemp *a1;
  uint32_t uVar2;
  TCGOpcode opc;
  TCGv_i64 in_64;
  TCGv_i32 in_32;
  ulong uVar3;
  uintptr_t o;
  TCGTemp *pTVar4;
  
  if (3 < vece) {
    if (have_avx1_m68k) {
      pTVar1 = tcg_temp_new_vec_m68k(tcg_ctx,TCG_TYPE_V128);
      tcg_gen_ld_vec_m68k(tcg_ctx,pTVar1,tcg_ctx->cpu_env,(ulong)aofs);
      uVar3 = 0;
      do {
        tcg_gen_st_vec_m68k(tcg_ctx,pTVar1,tcg_ctx->cpu_env,(ulong)(dofs + (int)uVar3));
        uVar3 = uVar3 + 0x10;
      } while (uVar3 < oprsz);
    }
    else {
      uVar3 = 0;
      pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
      a1 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
      pTVar1 = (TCGv_vec)((long)a1 - (long)tcg_ctx);
      tcg_gen_op3_m68k(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar4,
                       (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)aofs);
      tcg_gen_op3_m68k(tcg_ctx,INDEX_op_ld_i64,(TCGArg)a1,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx)
                       ,(ulong)(aofs + 8));
      uVar2 = dofs;
      do {
        tcg_gen_op3_m68k(tcg_ctx,INDEX_op_st_i64,(TCGArg)pTVar4,
                         (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)uVar2);
        tcg_gen_op3_m68k(tcg_ctx,INDEX_op_st_i64,(TCGArg)a1,
                         (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(uVar2 + 8));
        uVar3 = uVar3 + 0x10;
        uVar2 = uVar2 + 0x10;
      } while (uVar3 < oprsz);
      tcg_temp_free_internal_m68k(tcg_ctx,pTVar4);
    }
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    uVar2 = maxsz - oprsz;
    if (oprsz <= maxsz && uVar2 != 0) {
      do_dup(tcg_ctx,0,oprsz + dofs,uVar2,uVar2,(TCGv_i32)0x0,(TCGv_i64)0x0,0);
    }
    return;
  }
  type = choose_vector_type(tcg_ctx,(TCGOpcode *)0x0,vece,oprsz,false);
  if (type == TCG_TYPE_I32) {
    if (vece == 3) {
      pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
      in_64 = (TCGv_i64)((long)pTVar4 - (long)tcg_ctx);
      tcg_gen_op3_m68k(tcg_ctx,INDEX_op_ld_i64,(TCGArg)pTVar4,
                       (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)aofs);
      vece = 3;
      in_32 = (TCGv_i32)0x0;
    }
    else {
      pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
      in_32 = (TCGv_i32)((long)pTVar4 - (long)tcg_ctx);
      opc = INDEX_op_ld8u_i32;
      if (vece != 0) {
        opc = (uint)(vece != 1) * 2 + INDEX_op_ld16u_i32;
      }
      tcg_gen_op3_m68k(tcg_ctx,opc,(TCGArg)pTVar4,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                       (ulong)aofs);
      in_64 = (TCGv_i64)0x0;
    }
    do_dup(tcg_ctx,vece,dofs,oprsz,maxsz,in_32,in_64,0);
  }
  else {
    pTVar1 = tcg_temp_new_vec_m68k(tcg_ctx,type);
    tcg_gen_dup_mem_vec_m68k(tcg_ctx,vece,pTVar1,tcg_ctx->cpu_env,(ulong)aofs);
    do_dup_store(tcg_ctx,type,dofs,oprsz,maxsz,pTVar1);
    pTVar4 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  }
  tcg_temp_free_internal_m68k(tcg_ctx,pTVar4);
  return;
}

Assistant:

void tcg_gen_gvec_dup_mem(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                          uint32_t oprsz, uint32_t maxsz)
{
    check_size_align(oprsz, maxsz, dofs);
    if (vece <= MO_64) {
        TCGType type = choose_vector_type(tcg_ctx, NULL, vece, oprsz, 0);
        if (type != 0) {
            TCGv_vec t_vec = tcg_temp_new_vec(tcg_ctx, type);
            tcg_gen_dup_mem_vec(tcg_ctx, vece, t_vec, tcg_ctx->cpu_env, aofs);
            do_dup_store(tcg_ctx, type, dofs, oprsz, maxsz, t_vec);
            tcg_temp_free_vec(tcg_ctx, t_vec);
        } else if (vece <= MO_32) {
            TCGv_i32 in = tcg_temp_new_i32(tcg_ctx);
            switch (vece) {
            case MO_8:
                tcg_gen_ld8u_i32(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
                break;
            case MO_16:
                tcg_gen_ld16u_i32(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
                break;
            default:
                tcg_gen_ld_i32(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
                break;
            }
            do_dup(tcg_ctx, vece, dofs, oprsz, maxsz, in, NULL, 0);
            tcg_temp_free_i32(tcg_ctx, in);
        } else {
            TCGv_i64 in = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_ld_i64(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
            do_dup(tcg_ctx, vece, dofs, oprsz, maxsz, NULL, in, 0);
            tcg_temp_free_i64(tcg_ctx, in);
        }
    } else {
        /* 128-bit duplicate.  */
        /* ??? Dup to 256-bit vector.  */
        int i;

        tcg_debug_assert(vece == 4);
        tcg_debug_assert(oprsz >= 16);
        if (TCG_TARGET_HAS_v128) {
            TCGv_vec in = tcg_temp_new_vec(tcg_ctx, TCG_TYPE_V128);

            tcg_gen_ld_vec(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
            for (i = 0; i < oprsz; i += 16) {
                tcg_gen_st_vec(tcg_ctx, in, tcg_ctx->cpu_env, dofs + i);
            }
            tcg_temp_free_vec(tcg_ctx, in);
        } else {
            TCGv_i64 in0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 in1 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ld_i64(tcg_ctx, in0, tcg_ctx->cpu_env, aofs);
            tcg_gen_ld_i64(tcg_ctx, in1, tcg_ctx->cpu_env, aofs + 8);
            for (i = 0; i < oprsz; i += 16) {
                tcg_gen_st_i64(tcg_ctx, in0, tcg_ctx->cpu_env, dofs + i);
                tcg_gen_st_i64(tcg_ctx, in1, tcg_ctx->cpu_env, dofs + i + 8);
            }
            tcg_temp_free_i64(tcg_ctx, in0);
            tcg_temp_free_i64(tcg_ctx, in1);
        }
        if (oprsz < maxsz) {
            expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
        }
    }
}